

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLock::ConstraintsFetch_react(ChLinkLock *this,double factor)

{
  ChVector<double> *pCVar1;
  ChVector<double> *pCVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  pointer ppCVar29;
  ChConstraintTwoBodies *pCVar30;
  ChBodyFrame *pCVar31;
  ChMarker *pCVar32;
  ChMarker *pCVar33;
  ChLinkLimit *pCVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  int iVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ChMatrix34<> Ts;
  ChGlMatrix34<double> Gl_q2;
  ChMatrix44<> qs_tilde;
  ChMatrix44<> Chi__q1p_barT;
  assign_op<double,_double> local_289;
  double local_288;
  Matrix<double,_3,_4,_1,_3,_4> local_280;
  Product<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>
  local_220;
  undefined1 local_1e0 [40];
  undefined8 local_1b8;
  double local_1b0;
  double local_1a8;
  undefined8 local_1a0;
  double local_198;
  undefined8 local_190;
  double local_188;
  Matrix<double,_4,_4,_1,_4,_4> local_180;
  undefined1 local_100 [88];
  double local_a8;
  double local_a0;
  double local_98;
  undefined1 local_90 [16];
  
  pCVar1 = &(this->super_ChLinkMarkers).super_ChLink.react_force;
  if (pCVar1 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[0] = VNULL;
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = DAT_00b90ac8;
  }
  pCVar2 = &(this->super_ChLinkMarkers).super_ChLink.react_torque;
  if (pCVar2 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = VNULL;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = DAT_00b90ac8;
  }
  lVar37 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar37) {
    ppCVar29 = (this->mask).super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar40 = 0;
    iVar41 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar40) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar30 = ppCVar29[lVar40];
      if ((pCVar30->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if ((iVar41 < 0) ||
           ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_rows <= (long)iVar41)) goto LAB_00594da9;
        (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data
        .array[iVar41] = factor * (pCVar30->super_ChConstraintTwo).super_ChConstraint.l_i;
        iVar41 = iVar41 + 1;
      }
      lVar40 = lVar40 + 1;
    } while (lVar37 != lVar40);
  }
  pCVar31 = (this->super_ChLinkMarkers).super_ChLink.Body2;
  pCVar32 = (this->super_ChLinkMarkers).marker1;
  pCVar33 = (this->super_ChLinkMarkers).marker2;
  local_220.m_lhs.m_lhs.m_lhs.m_rhs.m_matrix =
       &(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  local_100._0_8_ = (pCVar32->abs_frame).super_ChFrame<double>.coord.rot.m_data[0];
  local_220.m_lhs.m_rhs = (RhsNested)local_100;
  local_100._8_8_ = (pCVar32->abs_frame).super_ChFrame<double>.coord.rot.m_data[1];
  local_100._16_8_ = (pCVar32->abs_frame).super_ChFrame<double>.coord.rot.m_data[2];
  local_100._24_8_ = (pCVar32->abs_frame).super_ChFrame<double>.coord.rot.m_data[3];
  auVar43._0_8_ = -(double)local_100._0_8_;
  auVar43._8_8_ = 0x8000000000000000;
  local_100._40_8_ = vmovlpd_avx(auVar43);
  auVar90._0_8_ = -(double)local_100._16_8_;
  auVar90._8_8_ = 0x8000000000000000;
  local_100._56_8_ = vmovlpd_avx(auVar90);
  auVar91._0_8_ = -(double)local_100._24_8_;
  auVar91._8_8_ = -(double)local_100._24_8_;
  local_100._72_16_ = vunpcklpd_avx(auVar91,auVar43);
  auVar67._0_8_ = -(double)local_100._8_8_;
  auVar67._8_8_ = 0x8000000000000000;
  local_90 = vunpcklpd_avx(auVar67,auVar43);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_220.m_rhs = &local_180;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar85._0_8_ =
       -local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[4];
  auVar85._8_8_ = 0x8000000000000000;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar85);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar92._0_8_ =
       -local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[7];
  auVar92._8_8_ =
       -local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[7];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] =
       (double)vmovlpd_avx(auVar92);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[9] =
       (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar95._0_8_ =
       -local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[9];
  auVar95._8_8_ = 0x8000000000000000;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       (double)vmovlpd_avx(auVar95);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       (double)vmovlpd_avx(auVar95);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xb]
       = (double)vmovlpd_avx(auVar85);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = (double)vmovlpd_avx(auVar92);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xe]
       = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xf]
       = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_1e0._8_8_ = (pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0]
  ;
  local_1a8 = (pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_1e0._8_8_ = (double)local_1e0._8_8_ + (double)local_1e0._8_8_;
  local_1a8 = local_1a8 + local_1a8;
  local_198 = (pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_198 = local_198 + local_198;
  local_1e0._16_8_ =
       (pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_1e0._16_8_ = (double)local_1e0._16_8_ + (double)local_1e0._16_8_;
  auVar93._0_8_ = -local_1a8;
  auVar93._8_8_ = 0x8000000000000000;
  local_220.m_lhs.m_lhs.m_rhs = (RhsNested)local_1e0;
  local_1e0._0_8_ = vmovlpd_avx(auVar93);
  auVar94._8_8_ = local_198;
  auVar94._0_8_ = local_198;
  auVar42._8_8_ = 0x8000000000000000;
  auVar42._0_8_ = 0x8000000000000000;
  local_1e0._24_16_ = vxorpd_avx512vl(auVar94,auVar42);
  auVar88._0_8_ = -(double)local_1e0._16_8_;
  auVar88._8_8_ = 0x8000000000000000;
  local_1b8 = vmovlpd_avx(auVar88);
  local_1a0 = vmovlpd_avx(auVar88);
  local_190 = vmovlpd_avx(auVar93);
  local_220.m_lhs.m_lhs.m_lhs.m_lhs.m_functor.m_other = 0.25;
  local_288 = factor;
  local_1b0 = (double)local_1e0._8_8_;
  local_188 = (double)local_1e0._8_8_;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5] =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [0];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [7];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[10]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[0];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xc]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[9];
  local_100._32_8_ = local_100._8_8_;
  local_100._48_8_ = local_100._24_8_;
  local_100._64_8_ = local_100._16_8_;
  local_a8 = (double)local_100._8_8_;
  local_a0 = (double)local_100._24_8_;
  local_98 = (double)local_100._16_8_;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,4,1,3,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>const>const>,Eigen::Matrix<double,3,4,1,3,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,1>,Eigen::internal::assign_op<double,double>>
            (&local_280,&local_220,&local_289);
  ppCVar29 = (this->mask).super_ChLinkMask.constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar39 = 0;
  if (((*ppCVar29)->super_ChConstraintTwo).super_ChConstraint.active != false) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        < 1) goto LAB_00594da9;
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[0];
    auVar86._0_8_ = -dVar3;
    auVar86._8_8_ = 0x8000000000000000;
    dVar4 = (double)vmovlpd_avx(auVar86);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[0] = dVar4;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] =
         dVar3 * -(this->super_ChLinkMarkers).relM.pos.m_data[2];
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] =
         dVar3 * (this->super_ChLinkMarkers).relM.pos.m_data[1];
    uVar39 = 1;
  }
  if ((ppCVar29[1]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)(ulong)uVar39) goto LAB_00594da9;
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[uVar39];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar3;
    auVar35._8_8_ = 0x8000000000000000;
    auVar35._0_8_ = 0x8000000000000000;
    auVar42 = vxorpd_avx512vl(auVar44,auVar35);
    dVar4 = (double)vmovlpd_avx(auVar42);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = dVar4;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] =
         dVar3 * (this->super_ChLinkMarkers).relM.pos.m_data[2];
    auVar68._8_8_ = 0;
    auVar68._0_8_ = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar42 = vfnmadd213sd_fma(auVar68,auVar44,auVar5);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar42._0_8_;
    uVar39 = uVar39 + 1;
  }
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_288;
  if ((ppCVar29[2]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)(ulong)uVar39) goto LAB_00594da9;
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar39];
    auVar36._8_8_ = 0x8000000000000000;
    auVar36._0_8_ = 0x8000000000000000;
    auVar42 = vxorpd_avx512vl(auVar45,auVar36);
    dVar3 = (double)vmovlpd_avx(auVar42);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = dVar3;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = (this->super_ChLinkMarkers).relM.pos.m_data[1];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar42 = vfnmadd213sd_fma(auVar87,auVar45,auVar6);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar42._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar42 = vfmadd213sd_fma(auVar69,auVar45,auVar7);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar42._0_8_;
    uVar39 = uVar39 + 1;
  }
  if ((ppCVar29[4]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    uVar38 = (ulong)uVar39;
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)uVar38) goto LAB_00594da9;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[1];
    auVar70._8_8_ = 0;
    auVar70._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar42 = vfmadd213sd_fma(auVar70,auVar46,auVar8);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar42._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[5];
    auVar71._8_8_ = 0;
    auVar71._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar42 = vfmadd213sd_fma(auVar71,auVar47,auVar9);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar42._0_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[9];
    auVar72._8_8_ = 0;
    auVar72._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar42 = vfmadd213sd_fma(auVar72,auVar48,auVar10);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar42._0_8_;
    uVar39 = uVar39 + 1;
  }
  if ((ppCVar29[5]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    uVar38 = (ulong)uVar39;
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)uVar38) goto LAB_00594da9;
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[2];
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar42 = vfmadd213sd_fma(auVar73,auVar49,auVar11);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar42._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[6];
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar42 = vfmadd213sd_fma(auVar74,auVar50,auVar12);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar42._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[10];
    auVar75._8_8_ = 0;
    auVar75._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar42 = vfmadd213sd_fma(auVar75,auVar51,auVar13);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar42._0_8_;
    uVar39 = uVar39 + 1;
  }
  if ((ppCVar29[6]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    uVar38 = (ulong)uVar39;
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)uVar38) {
LAB_00594da9:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 7, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 7, 1>, Level = 1]"
                   );
    }
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[3];
    auVar76._8_8_ = 0;
    auVar76._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar42 = vfmadd213sd_fma(auVar76,auVar52,auVar14);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar42._0_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[7];
    auVar77._8_8_ = 0;
    auVar77._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar42 = vfmadd213sd_fma(auVar77,auVar53,auVar15);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar42._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[0xb];
    auVar78._8_8_ = 0;
    auVar78._0_8_ =
         (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
         m_data.array[uVar38];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar42 = vfmadd213sd_fma(auVar78,auVar54,auVar16);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar42._0_8_;
  }
  pCVar34 = (this->limit_X)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar34 != (ChLinkLimit *)0x0) && (pCVar34->m_active == true)) {
    if (*(bool *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(double *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x10);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = pCVar1->m_data[0];
      auVar42 = vfnmadd213sd_fma(auVar55,auVar89,auVar17);
      pCVar1->m_data[0] = auVar42._0_8_;
    }
    if (*(bool *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(double *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x10);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = pCVar1->m_data[0];
      auVar42 = vfmadd213sd_fma(auVar56,auVar89,auVar18);
      pCVar1->m_data[0] = auVar42._0_8_;
    }
  }
  pCVar34 = (this->limit_Y)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar34 != (ChLinkLimit *)0x0) && (pCVar34->m_active == true)) {
    if (*(bool *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(double *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x10);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1];
      auVar42 = vfnmadd213sd_fma(auVar57,auVar89,auVar19);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = auVar42._0_8_;
    }
    if (*(bool *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(double *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x10);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1];
      auVar42 = vfmadd213sd_fma(auVar58,auVar89,auVar20);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = auVar42._0_8_;
    }
  }
  pCVar34 = (this->limit_Z)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar34 != (ChLinkLimit *)0x0) && (pCVar34->m_active == true)) {
    if (*(bool *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(double *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x10);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2];
      auVar42 = vfnmadd213sd_fma(auVar59,auVar89,auVar21);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = auVar42._0_8_;
    }
    if (*(bool *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(double *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x10);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2];
      auVar42 = vfmadd213sd_fma(auVar60,auVar89,auVar22);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = auVar42._0_8_;
    }
  }
  pCVar34 = (this->limit_Rx)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar34 != (ChLinkLimit *)0x0) && (pCVar34->m_active == true)) {
    if (*(bool *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(double *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x10);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = pCVar2->m_data[0];
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_288 * -0.5;
      auVar42 = vfmadd213sd_fma(auVar79,auVar61,auVar23);
      pCVar2->m_data[0] = auVar42._0_8_;
    }
    if (*(bool *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(double *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x10);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = pCVar2->m_data[0];
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_288 * 0.5;
      auVar42 = vfmadd213sd_fma(auVar80,auVar62,auVar24);
      pCVar2->m_data[0] = auVar42._0_8_;
    }
  }
  pCVar34 = (this->limit_Ry)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar34 != (ChLinkLimit *)0x0) && (pCVar34->m_active == true)) {
    if (*(bool *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(double *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x10);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_288 * -0.5;
      auVar42 = vfmadd213sd_fma(auVar81,auVar63,auVar25);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar42._0_8_;
    }
    if (*(bool *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(double *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x10);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_288 * 0.5;
      auVar42 = vfmadd213sd_fma(auVar82,auVar64,auVar26);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar42._0_8_;
    }
  }
  pCVar34 = (this->limit_Rz)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar34 != (ChLinkLimit *)0x0) && (pCVar34->m_active == true)) {
    if (*(bool *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(double *)((long)&(pCVar34->constr_lower).super_ChConstraintTwo + 0x10);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_288 * -0.5;
      auVar42 = vfmadd213sd_fma(auVar83,auVar65,auVar27);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar42._0_8_;
    }
    if (*(bool *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar84._8_8_ = 0;
      auVar84._0_8_ = *(double *)((long)&(pCVar34->constr_upper).super_ChConstraintTwo + 0x10);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_288 * 0.5;
      auVar42 = vfmadd213sd_fma(auVar84,auVar66,auVar28);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar42._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsFetch_react(double factor) {
    react_force = VNULL;
    react_torque = VNULL;

    // From constraints to react vector:
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            react(cnt) = mask.Constr_N(i).Get_l_i() * factor;
            cnt++;
        }
    }

    // From react vector to the 'intuitive' react_force and react_torque
    const ChQuaternion<>& q2 = Body2->GetRot();
    const ChQuaternion<>& q1p = marker1->GetAbsCoord().rot;
    const ChQuaternion<>& qs = marker2->GetCoord().rot;
    const ChMatrix33<>& Cs = marker2->GetA();

    ChMatrix44<> Chi__q1p_barT;  //[Chi] * [transpose(bar(q1p))]
    Chi__q1p_barT(0, 0) = q1p.e0();
    Chi__q1p_barT(0, 1) = q1p.e1();
    Chi__q1p_barT(0, 2) = q1p.e2();
    Chi__q1p_barT(0, 3) = q1p.e3();
    Chi__q1p_barT(1, 0) = q1p.e1();
    Chi__q1p_barT(1, 1) = -q1p.e0();
    Chi__q1p_barT(1, 2) = q1p.e3();
    Chi__q1p_barT(1, 3) = -q1p.e2();
    Chi__q1p_barT(2, 0) = q1p.e2();
    Chi__q1p_barT(2, 1) = -q1p.e3();
    Chi__q1p_barT(2, 2) = -q1p.e0();
    Chi__q1p_barT(2, 3) = q1p.e1();
    Chi__q1p_barT(3, 0) = q1p.e3();
    Chi__q1p_barT(3, 1) = q1p.e2();
    Chi__q1p_barT(3, 2) = -q1p.e1();
    Chi__q1p_barT(3, 3) = -q1p.e0();

    ChMatrix44<> qs_tilde;
    qs_tilde(0, 0) = qs.e0();
    qs_tilde(0, 1) = -qs.e1();
    qs_tilde(0, 2) = -qs.e2();
    qs_tilde(0, 3) = -qs.e3();
    qs_tilde(1, 0) = qs.e1();
    qs_tilde(1, 1) = qs.e0();
    qs_tilde(1, 2) = -qs.e3();
    qs_tilde(1, 3) = qs.e2();
    qs_tilde(2, 0) = qs.e2();
    qs_tilde(2, 1) = qs.e3();
    qs_tilde(2, 2) = qs.e0();
    qs_tilde(2, 3) = -qs.e1();
    qs_tilde(3, 0) = qs.e3();
    qs_tilde(3, 1) = -qs.e2();
    qs_tilde(3, 2) = qs.e1();
    qs_tilde(3, 3) = qs.e0();

    // Ts = 0.5*CsT*G(q2)*Chi*(q1 qp)_barT*qs~*KT*lambda
    ChGlMatrix34<> Gl_q2(q2);
    ChMatrix34<> Ts = 0.25 * Cs.transpose() * Gl_q2 * Chi__q1p_barT * qs_tilde;

    // Translational constraint reaction force = -lambda_translational
    // Translational constraint reaction torque = -d~''(t)*lambda_translational
    // No reaction force from the rotational constraints

    int n_constraint = 0;

    if (mask.Constr_X().IsActive()) {
        react_force.x() = -react(n_constraint);
        react_torque.y() = -relM.pos.z() * react(n_constraint);
        react_torque.z() = relM.pos.y() * react(n_constraint);
        n_constraint++;
    }
    if (mask.Constr_Y().IsActive()) {
        react_force.y() = -react(n_constraint);
        react_torque.x() = relM.pos.z() * react(n_constraint);
        react_torque.z() += -relM.pos.x() * react(n_constraint);
        n_constraint++;
    }
    if (mask.Constr_Z().IsActive()) {
        react_force.z() = -react(n_constraint);
        react_torque.x() += -relM.pos.y() * react(n_constraint);
        react_torque.y() += relM.pos.x() * react(n_constraint);
        n_constraint++;
    }

    if (mask.Constr_E1().IsActive()) {
        react_torque.x() += Ts(0, 1) * (react(n_constraint));
        react_torque.y() += Ts(1, 1) * (react(n_constraint));
        react_torque.z() += Ts(2, 1) * (react(n_constraint));
        n_constraint++;
    }
    if (mask.Constr_E2().IsActive()) {
        react_torque.x() += Ts(0, 2) * (react(n_constraint));
        react_torque.y() += Ts(1, 2) * (react(n_constraint));
        react_torque.z() += Ts(2, 2) * (react(n_constraint));
        n_constraint++;
    }
    if (mask.Constr_E3().IsActive()) {
        react_torque.x() += Ts(0, 3) * (react(n_constraint));
        react_torque.y() += Ts(1, 3) * (react(n_constraint));
        react_torque.z() += Ts(2, 3) * (react(n_constraint));
        n_constraint++;
    }

    // ***TO DO***?: TRANSFORMATION FROM delta COORDS TO LINK COORDS, if
    // non-default delta
    // if delta rotation?

    // add also the contribution from link limits to the react_force and
    // react_torque.
    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            react_force.x() -= factor * limit_X->constr_lower.Get_l_i();
        }
        if (limit_X->constr_upper.IsActive()) {
            react_force.x() += factor * limit_X->constr_upper.Get_l_i();
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            react_force.y() -= factor * limit_Y->constr_lower.Get_l_i();
        }
        if (limit_Y->constr_upper.IsActive()) {
            react_force.y() += factor * limit_Y->constr_upper.Get_l_i();
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            react_force.z() -= factor * limit_Z->constr_lower.Get_l_i();
        }
        if (limit_Z->constr_upper.IsActive()) {
            react_force.z() += factor * limit_Z->constr_upper.Get_l_i();
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            react_torque.x() -= 0.5 * factor * limit_Rx->constr_lower.Get_l_i();
        }
        if (limit_Rx->constr_upper.IsActive()) {
            react_torque.x() += 0.5 * factor * limit_Rx->constr_upper.Get_l_i();
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            react_torque.y() -= 0.5 * factor * limit_Ry->constr_lower.Get_l_i();
        }
        if (limit_Ry->constr_upper.IsActive()) {
            react_torque.y() += 0.5 * factor * limit_Ry->constr_upper.Get_l_i();
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            react_torque.z() -= 0.5 * factor * limit_Rz->constr_lower.Get_l_i();
        }
        if (limit_Rz->constr_upper.IsActive()) {
            react_torque.z() += 0.5 * factor * limit_Rz->constr_upper.Get_l_i();
        }
    }

    // the internal forces add their contribute to the reactions
    // NOT NEEDED?, since C_force and react_force must stay separated???
    // react_force  = Vadd(react_force, C_force);
    // react_torque = Vadd(react_torque, C_torque);
}